

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcap.c
# Opt level: O2

int runtimecap(CapState *cs,Capture *close,char *s,int *rem)

{
  lua_State *L;
  int iVar1;
  int idx;
  int iVar2;
  Capture *cap;
  int iVar3;
  int i;
  
  L = cs->L;
  iVar1 = lua_gettop(L);
  cap = findopen(close);
  idx = finddyncap(cap,close);
  close->kind = '\0';
  close->s = s;
  cs->cap = cap;
  cs->valuecached = 0;
  luaL_checkstack(L,4,"too many runtime captures");
  lua_rawgeti(cs->L,cs->ptop + 3,(ulong)cs->cap->idx);
  lua_pushvalue(L,2);
  lua_pushinteger(L,(lua_Integer)(s + (1 - (long)cs->s)));
  iVar3 = 0;
  iVar2 = pushnestedvalues(cs,0);
  lua_callk(L,iVar2 + 2,-1,0,(lua_KFunction)0x0);
  iVar2 = idx;
  if (idx != 0) {
    for (; iVar2 <= iVar1; iVar2 = iVar2 + 1) {
      lua_rotate(L,idx,-1);
      lua_settop(L,-2);
    }
    iVar3 = (iVar1 - idx) + 1;
  }
  *rem = iVar3;
  return (int)((ulong)((long)close - (long)cap) >> 4);
}

Assistant:

int runtimecap (CapState *cs, Capture *close, const char *s, int *rem) {
  int n, id;
  lua_State *L = cs->L;
  int otop = lua_gettop(L);
  Capture *open = findopen(close);
  assert(captype(open) == Cgroup);
  id = finddyncap(open, close);  /* get first dynamic capture argument */
  close->kind = Cclose;  /* closes the group */
  close->s = s;
  cs->cap = open; cs->valuecached = 0;  /* prepare capture state */
  luaL_checkstack(L, 4, "too many runtime captures");
  pushluaval(cs);  /* push function to be called */
  lua_pushvalue(L, SUBJIDX);  /* push original subject */
  lua_pushinteger(L, s - cs->s + 1);  /* push current position */
  n = pushnestedvalues(cs, 0);  /* push nested captures */
  lua_call(L, n + 2, LUA_MULTRET);  /* call dynamic function */
  if (id > 0) {  /* are there old dynamic captures to be removed? */
    int i;
    for (i = id; i <= otop; i++)
      lua_remove(L, id);  /* remove old dynamic captures */
    *rem = otop - id + 1;  /* total number of dynamic captures removed */
  }
  else
    *rem = 0;  /* no dynamic captures removed */
  return close - open;  /* number of captures of all kinds removed */
}